

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O1

JointIndex __thiscall
iDynTree::Model::addJoint
          (Model *this,string *link1,string *link2,string *jointName,IJointConstPtr joint)

{
  int iVar1;
  undefined4 extraout_var;
  LinkIndex LVar2;
  LinkIndex LVar3;
  long *plVar4;
  JointIndex JVar5;
  long *plVar6;
  string error;
  long *local_70;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  IJointConstPtr joint_00;
  
  iVar1 = (*joint->_vptr_IJoint[2])(joint);
  joint_00 = (IJointConstPtr)CONCAT44(extraout_var,iVar1);
  LVar2 = getLinkIndex(this,link1);
  LVar3 = getLinkIndex(this,link2);
  if (LVar2 == LINK_INVALID_INDEX) {
    std::operator+(&local_50,"a link of name ",link1);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    iDynTree::reportError("Model","addJoint",(char *)local_70);
  }
  else {
    if (LVar3 != LINK_INVALID_INDEX) {
      (*joint_00->_vptr_IJoint[5])(joint_00,LVar2,LVar3);
      JVar5 = addJoint(this,jointName,joint_00);
      (*joint_00->_vptr_IJoint[1])(joint_00);
      return JVar5;
    }
    std::operator+(&local_50,"a link of name ",link2);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_70 = &local_60;
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_60 = *plVar6;
      lStack_58 = plVar4[3];
    }
    else {
      local_60 = *plVar6;
      local_70 = (long *)*plVar4;
    }
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    iDynTree::reportError("Model","addJoint",(char *)local_70);
  }
  JVar5 = JOINT_INVALID_INDEX;
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  return JVar5;
}

Assistant:

JointIndex Model::addJoint(const std::string & link1, const std::string & link2,
                            const std::string & jointName, IJointConstPtr joint)
{
    IJointPtr jointCopy = joint->clone();

    LinkIndex link1Index = this->getLinkIndex(link1);
    LinkIndex link2Index = this->getLinkIndex(link2);

    if( link1Index == LINK_INVALID_INDEX )
    {
        std::string error = "a link of name " + link1 + " is not present in the model";
        reportError("Model","addJoint",error.c_str());
        return JOINT_INVALID_INDEX;
    }

    if( link2Index == LINK_INVALID_INDEX )
    {
        std::string error = "a link of name " + link2 + " is not present in the model";
        reportError("Model","addJoint",error.c_str());
        return JOINT_INVALID_INDEX;
    }

    jointCopy->setAttachedLinks(link1Index,link2Index);

    JointIndex jntIdx = addJoint(jointName,jointCopy);

    delete jointCopy;

    return jntIdx;
}